

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O1

void __thiscall DriverTest_Glob_Test::TestBody(DriverTest_Glob_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  ParamType *pPVar5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  anon_class_16_2_6acbd76d check;
  string root;
  string rawRoot;
  anon_class_40_2_d7075ad8 put;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  anon_class_40_2_d7075ad8 resolve;
  string type;
  Arbiter a;
  allocator_type local_682;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_681;
  anon_class_16_2_6acbd76d local_680;
  string local_670;
  undefined1 *local_650;
  long local_648;
  undefined1 local_640 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  undefined1 *local_610 [2];
  undefined1 local_600 [16];
  undefined1 *local_5f0 [2];
  undefined1 local_5e0 [16];
  undefined1 *local_5d0 [2];
  undefined1 local_5c0 [16];
  undefined1 *local_5b0 [2];
  undefined1 local_5a0 [16];
  undefined1 *local_590 [2];
  undefined1 local_580 [16];
  undefined1 local_570 [8];
  _Alloc_hider local_568;
  char local_558 [16];
  undefined1 *local_548 [2];
  undefined1 local_538 [16];
  undefined1 *local_528 [2];
  undefined1 local_518 [16];
  undefined1 local_508 [8];
  undefined1 *local_500;
  undefined1 local_4f0 [16];
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  undefined1 *local_300 [2];
  undefined1 local_2f0 [16];
  undefined1 *local_2e0 [2];
  undefined1 local_2d0 [16];
  undefined1 *local_2c0 [2];
  undefined1 local_2b0 [16];
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<arbiter::Driver>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<arbiter::Driver>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<arbiter::Driver>_>_>_>
  local_68 [48];
  Pool *local_38;
  
  arbiter::Arbiter::Arbiter((Arbiter *)local_b0);
  pPVar5 = testing::
           WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::GetParam(&(this->super_DriverTest).
                       super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .
                       super_WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     );
  local_650 = local_640;
  pcVar2 = (pPVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_650,pcVar2,pcVar2 + pPVar5->_M_string_length);
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char*>((string *)local_280,local_650,local_650 + local_648);
  cVar3 = arbiter::Arbiter::isLocal((Arbiter *)local_b0,local_280);
  if (cVar3 == '\0') {
    local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_670,local_650,local_650 + local_648);
  }
  else {
    local_2a0[0] = local_290;
    std::__cxx11::string::_M_construct<char*>((string *)local_2a0,local_650,local_650 + local_648);
    arbiter::stripProtocol(&local_670,local_2a0);
    if (local_2a0[0] != local_290) {
      operator_delete(local_2a0[0]);
    }
  }
  if (local_280[0] != local_270) {
    operator_delete(local_280[0]);
  }
  local_2e0[0] = local_2d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2e0,local_670._M_dataplus._M_p,
             local_670._M_dataplus._M_p + local_670._M_string_length);
  arbiter::getProtocol(local_2c0,local_2e0);
  if (local_2e0[0] != local_2d0) {
    operator_delete(local_2e0[0]);
  }
  iVar4 = std::__cxx11::string::compare((char *)local_2c0);
  if ((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)local_2c0), iVar4 != 0)) {
    local_568._M_p = local_558;
    local_570 = (undefined1  [8])local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_568,local_670._M_dataplus._M_p,
               local_670._M_dataplus._M_p + local_670._M_string_length);
    local_300[0] = local_2f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_300,local_670._M_dataplus._M_p,
               local_670._M_dataplus._M_p + local_670._M_string_length);
    cVar3 = arbiter::Arbiter::isLocal(local_b0,local_300);
    if (local_300[0] != local_2f0) {
      operator_delete(local_300[0]);
    }
    if (cVar3 != '\0') {
      local_528[0] = local_518;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_528,local_670._M_dataplus._M_p,
                 local_670._M_dataplus._M_p + local_670._M_string_length);
      std::__cxx11::string::append((char *)local_528);
      arbiter::mkdirp(local_528);
      if (local_528[0] != local_518) {
        operator_delete(local_528[0]);
      }
      local_548[0] = local_538;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_548,local_670._M_dataplus._M_p,
                 local_670._M_dataplus._M_p + local_670._M_string_length);
      std::__cxx11::string::append((char *)local_548);
      arbiter::mkdirp(local_548);
      if (local_548[0] != local_538) {
        operator_delete(local_548[0]);
      }
    }
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"one.txt","");
    TestBody::anon_class_40_2_d7075ad8::operator()((anon_class_40_2_d7075ad8 *)local_570,&local_320)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"two.txt","");
    TestBody::anon_class_40_2_d7075ad8::operator()((anon_class_40_2_d7075ad8 *)local_570,&local_340)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p);
    }
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"a/one.txt","");
    TestBody::anon_class_40_2_d7075ad8::operator()((anon_class_40_2_d7075ad8 *)local_570,&local_360)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p);
    }
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"a/two.txt","");
    TestBody::anon_class_40_2_d7075ad8::operator()((anon_class_40_2_d7075ad8 *)local_570,&local_380)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p);
    }
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"a/b/one.txt","");
    TestBody::anon_class_40_2_d7075ad8::operator()((anon_class_40_2_d7075ad8 *)local_570,&local_3a0)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p);
    }
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"a/b/two.txt","");
    TestBody::anon_class_40_2_d7075ad8::operator()((anon_class_40_2_d7075ad8 *)local_570,&local_3c0)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p);
    }
    local_500 = local_4f0;
    local_508 = (undefined1  [8])local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_500,local_670._M_dataplus._M_p,
               local_670._M_dataplus._M_p + local_670._M_string_length);
    local_680.resolve = (anon_class_40_2_d7075ad8 *)local_508;
    local_680.root = &local_670;
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"*","");
    paVar1 = &local_630.field_2;
    local_630._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"one.txt","");
    local_610[0] = local_600;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"two.txt","");
    __l._M_len = 2;
    __l._M_array = &local_630;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_e0,__l,&local_681,&local_682);
    TestBody::anon_class_16_2_6acbd76d::operator()(&local_680,&local_3e0,(Paths *)&local_e0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_e0);
    lVar6 = 0;
    do {
      if (local_600 + lVar6 != *(undefined1 **)((long)local_610 + lVar6)) {
        operator_delete(*(undefined1 **)((long)local_610 + lVar6));
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != -0x40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p);
    }
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"a/*","");
    local_630._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"a/one.txt","");
    local_610[0] = local_600;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"a/two.txt","");
    __l_00._M_len = 2;
    __l_00._M_array = &local_630;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_110,__l_00,&local_681,&local_682);
    TestBody::anon_class_16_2_6acbd76d::operator()(&local_680,&local_400,(Paths *)&local_110);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_110);
    lVar6 = 0;
    do {
      if (local_600 + lVar6 != *(undefined1 **)((long)local_610 + lVar6)) {
        operator_delete(*(undefined1 **)((long)local_610 + lVar6));
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != -0x40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p);
    }
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"a/b/*","");
    local_630._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"a/b/one.txt","");
    local_610[0] = local_600;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"a/b/two.txt","");
    __l_01._M_len = 2;
    __l_01._M_array = &local_630;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_140,__l_01,&local_681,&local_682);
    TestBody::anon_class_16_2_6acbd76d::operator()(&local_680,&local_420,(Paths *)&local_140);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_140);
    lVar6 = 0;
    do {
      if (local_600 + lVar6 != *(undefined1 **)((long)local_610 + lVar6)) {
        operator_delete(*(undefined1 **)((long)local_610 + lVar6));
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != -0x40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p);
    }
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"**","");
    local_630._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"one.txt","");
    local_610[0] = local_600;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"two.txt","");
    local_5f0[0] = local_5e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"a/one.txt","");
    local_5d0[0] = local_5c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5d0,"a/two.txt","");
    local_5b0[0] = local_5a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"a/b/one.txt","");
    local_590[0] = local_580;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"a/b/two.txt","");
    __l_02._M_len = 6;
    __l_02._M_array = &local_630;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_170,__l_02,&local_681,&local_682);
    TestBody::anon_class_16_2_6acbd76d::operator()(&local_680,&local_440,(Paths *)&local_170);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_170);
    lVar6 = 0;
    do {
      if (local_580 + lVar6 != *(undefined1 **)((long)local_590 + lVar6)) {
        operator_delete(*(undefined1 **)((long)local_590 + lVar6));
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != -0xc0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p);
    }
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"a/**","");
    local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"a/one.txt","");
    local_610[0] = local_600;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"a/two.txt","");
    local_5f0[0] = local_5e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"a/b/one.txt","");
    local_5d0[0] = local_5c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5d0,"a/b/two.txt","");
    paVar1 = &local_630.field_2;
    __l_03._M_len = 4;
    __l_03._M_array = &local_630;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_1a0,__l_03,&local_681,&local_682);
    TestBody::anon_class_16_2_6acbd76d::operator()(&local_680,&local_460,(Paths *)&local_1a0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1a0);
    lVar6 = 0;
    do {
      if (local_5c0 + lVar6 != *(undefined1 **)((long)local_5d0 + lVar6)) {
        operator_delete(*(undefined1 **)((long)local_5d0 + lVar6));
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != -0x80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p);
    }
    local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"a/b/**","");
    local_630._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"a/b/one.txt","");
    local_610[0] = local_600;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"a/b/two.txt","");
    __l_04._M_len = 2;
    __l_04._M_array = &local_630;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_1d0,__l_04,&local_681,&local_682);
    TestBody::anon_class_16_2_6acbd76d::operator()(&local_680,&local_480,(Paths *)&local_1d0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1d0);
    lVar6 = 0;
    do {
      if (local_600 + lVar6 != *(undefined1 **)((long)local_610 + lVar6)) {
        operator_delete(*(undefined1 **)((long)local_610 + lVar6));
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != -0x40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480._M_dataplus._M_p != &local_480.field_2) {
      operator_delete(local_480._M_dataplus._M_p);
    }
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"");
    local_630._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"");
    __l_05._M_len = 1;
    __l_05._M_array = &local_630;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_200,__l_05,&local_681,&local_682);
    TestBody::anon_class_16_2_6acbd76d::operator()(&local_680,&local_4a0,(Paths *)&local_200);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_630._M_dataplus._M_p != paVar1) {
      operator_delete(local_630._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p);
    }
    local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"asdf","");
    local_630._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"asdf","");
    __l_06._M_len = 1;
    __l_06._M_array = &local_630;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_230,__l_06,&local_681,&local_682);
    TestBody::anon_class_16_2_6acbd76d::operator()(&local_680,&local_4c0,(Paths *)&local_230);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_630._M_dataplus._M_p != paVar1) {
      operator_delete(local_630._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
      operator_delete(local_4c0._M_dataplus._M_p);
    }
    local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"asdf.txt","");
    local_630._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"asdf.txt","");
    __l_07._M_len = 1;
    __l_07._M_array = &local_630;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_260,__l_07,&local_681,&local_682);
    TestBody::anon_class_16_2_6acbd76d::operator()(&local_680,&local_4e0,(Paths *)&local_260);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_630._M_dataplus._M_p != paVar1) {
      operator_delete(local_630._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
      operator_delete(local_4e0._M_dataplus._M_p);
    }
    if (local_500 != local_4f0) {
      operator_delete(local_500);
    }
    if (local_568._M_p != local_558) {
      operator_delete(local_568._M_p);
    }
  }
  if (local_2c0[0] != local_2b0) {
    operator_delete(local_2c0[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p);
  }
  if (local_650 != local_640) {
    operator_delete(local_650);
  }
  if (local_38 != (Pool *)0x0) {
    arbiter::http::Pool::~Pool(local_38);
    operator_delete(local_38);
  }
  local_38 = (Pool *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<arbiter::Driver>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<arbiter::Driver>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<arbiter::Driver>_>_>_>
  ::~_Rb_tree(local_68);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  return;
}

Assistant:

TEST_P(DriverTest, Glob)
{
    using Paths = std::set<std::string>;
    Arbiter a;

    const std::string rawRoot(GetParam());

    // Local directories explicitly prefixed with file:// will be returned
    // without that prefix, so strip that off.
    const std::string root(
            a.isLocal(rawRoot) ? stripProtocol(rawRoot) : rawRoot);
    const std::string type(getProtocol(root));

    // No `ls` for plain HTTP/s.
    if (type == "http" || type == "https") return;

    auto put([&a, root](std::string p)
    {
        EXPECT_NO_THROW(a.put(root + p, p));
    });

    if (a.isLocal(root))
    {
        mkdirp(root + "a");
        mkdirp(root + "a/b");
    }

    put("one.txt");
    put("two.txt");
    put("a/one.txt");
    put("a/two.txt");
    put("a/b/one.txt");
    put("a/b/two.txt");

    auto resolve([&a, root](std::string p)
    {
        const auto v = a.resolve(root + p);
        return Paths(v.begin(), v.end());
    });

    auto check([&](std::string p, Paths exp)
    {
        const auto got(resolve(p));
        EXPECT_GE(got.size(), exp.size());

        for (const auto& s : exp)
        {
            EXPECT_TRUE(got.count(root + s)) << p << ": " << root << s;
        }
    });

    // Non-recursive.
    check("*", Paths { "one.txt", "two.txt" });
    check("a/*", Paths { "a/one.txt", "a/two.txt" });
    check("a/b/*", Paths { "a/b/one.txt", "a/b/two.txt" });

    // Recursive.
    check("**", Paths {
            "one.txt", "two.txt",
            "a/one.txt", "a/two.txt",
            "a/b/one.txt", "a/b/two.txt"
        }
    );

    check("a/**", Paths {
            "a/one.txt", "a/two.txt",
            "a/b/one.txt", "a/b/two.txt"
        }
    );

    check("a/b/**", Paths { "a/b/one.txt", "a/b/two.txt" });

    // Not globs - files resolve to themselves.
    check("", Paths { "" });
    check("asdf", Paths { "asdf" });
    check("asdf.txt", Paths { "asdf.txt" });
}